

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRVersionFromMemory(EXRVersion *version,uchar *memory)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -3;
  if (memory != (uchar *)0x0 && version != (EXRVersion *)0x0) {
    iVar1 = -1;
    if (*(int *)memory == 0x1312f76) {
      lVar2 = (ulong)(*(int *)memory == 0x1312f76) * 4;
      version->tiled = 0;
      version->long_name = 0;
      version->non_image = 0;
      version->multipart = 0;
      iVar1 = -2;
      if (memory[lVar2] == '\x02') {
        version->version = 2;
        if ((memory[lVar2 + 1] & 2) != 0) {
          version->tiled = 1;
        }
        if ((memory[lVar2 + 1] & 4) != 0) {
          version->long_name = 1;
        }
        if ((memory[lVar2 + 1] & 8) != 0) {
          version->non_image = 1;
        }
        iVar1 = 0;
        if ((memory[lVar2 + 1] & 0x10) != 0) {
          version->multipart = 1;
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int ParseEXRVersionFromMemory(EXRVersion *version,
                              const unsigned char *memory) {
  if (version == NULL || memory == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *marker = memory;

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      return TINYEXR_ERROR_INVALID_MAGIC_NUMBER;
    }
    marker += 4;
  }

  version->tiled = false;
  version->long_name = false;
  version->non_image = false;
  version->multipart = false;

  // Parse version header.
  {
    // must be 2
    if (marker[0] != 2) {
      return TINYEXR_ERROR_INVALID_EXR_VERSION;
    }

    if (version == NULL) {
      return TINYEXR_SUCCESS;  // May OK
    }

    version->version = 2;

    if (marker[1] & 0x2) {  // 9th bit
      version->tiled = true;
    }
    if (marker[1] & 0x4) {  // 10th bit
      version->long_name = true;
    }
    if (marker[1] & 0x8) {        // 11th bit
      version->non_image = true;  // (deep image)
    }
    if (marker[1] & 0x10) {  // 12th bit
      version->multipart = true;
    }
  }

  return TINYEXR_SUCCESS;
}